

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minja.hpp
# Opt level: O0

pair<std::shared_ptr<minja::Expression>,_std::shared_ptr<minja::Expression>_> * __thiscall
minja::Parser::parseIfExpression(Parser *this)

{
  bool bVar1;
  byte bVar2;
  int iVar3;
  runtime_error *prVar4;
  regex *in_RSI;
  Parser *in_RDI;
  bool in_stack_00000027;
  Parser *in_stack_00000028;
  shared_ptr<minja::Expression> else_expr;
  shared_ptr<minja::Expression> condition;
  shared_ptr<minja::Expression> *in_stack_ffffffffffffff58;
  shared_ptr<minja::Expression> *in_stack_ffffffffffffff60;
  undefined7 in_stack_ffffffffffffff68;
  pair<std::shared_ptr<minja::Expression>,_std::shared_ptr<minja::Expression>_>
  *in_stack_ffffffffffffff70;
  flag_type in_stack_ffffffffffffff94;
  char *in_stack_ffffffffffffff98;
  basic_regex<char,_std::__cxx11::regex_traits<char>_> *in_stack_ffffffffffffffa0;
  __shared_ptr local_40 [32];
  __shared_ptr local_20 [12];
  SpaceHandling in_stack_ffffffffffffffec;
  Parser *this_00;
  
  this_00 = in_RDI;
  parseLogicalOr(in_RDI);
  bVar1 = std::__shared_ptr::operator_cast_to_bool(local_20);
  if (!bVar1) {
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar4,"Expected condition expression");
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if ((parseIfExpression()::else_tok_abi_cxx11_ == '\0') &&
     (iVar3 = __cxa_guard_acquire(&parseIfExpression()::else_tok_abi_cxx11_), iVar3 != 0)) {
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
              (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff94);
    __cxa_atexit(std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex,
                 &parseIfExpression()::else_tok_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&parseIfExpression()::else_tok_abi_cxx11_);
  }
  std::shared_ptr<minja::Expression>::shared_ptr((shared_ptr<minja::Expression> *)0x34525c);
  consumeToken(this_00,in_RSI,in_stack_ffffffffffffffec);
  bVar2 = std::__cxx11::string::empty();
  bVar2 = bVar2 ^ 0xff;
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffa0);
  if ((bVar2 & 1) != 0) {
    parseExpression(in_stack_00000028,in_stack_00000027);
    std::shared_ptr<minja::Expression>::operator=
              (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    std::shared_ptr<minja::Expression>::~shared_ptr((shared_ptr<minja::Expression> *)0x3452cf);
    bVar1 = std::__shared_ptr::operator_cast_to_bool(local_40);
    if (!bVar1) {
      prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar4,"Expected \'else\' expression");
      __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  std::pair<std::shared_ptr<minja::Expression>,_std::shared_ptr<minja::Expression>_>::
  pair<std::shared_ptr<minja::Expression>,_std::shared_ptr<minja::Expression>,_true>
            (in_stack_ffffffffffffff70,
             (shared_ptr<minja::Expression> *)CONCAT17(bVar2,in_stack_ffffffffffffff68),
             in_stack_ffffffffffffff60);
  std::shared_ptr<minja::Expression>::~shared_ptr((shared_ptr<minja::Expression> *)0x345395);
  std::shared_ptr<minja::Expression>::~shared_ptr((shared_ptr<minja::Expression> *)0x3453a2);
  return (pair<std::shared_ptr<minja::Expression>,_std::shared_ptr<minja::Expression>_> *)in_RDI;
}

Assistant:

std::pair<std::shared_ptr<Expression>, std::shared_ptr<Expression>> parseIfExpression() {
        auto condition = parseLogicalOr();
        if (!condition) throw std::runtime_error("Expected condition expression");

        static std::regex else_tok(R"(else\b)");
        std::shared_ptr<Expression> else_expr;
        if (!consumeToken(else_tok).empty()) {
          else_expr = parseExpression();
          if (!else_expr) throw std::runtime_error("Expected 'else' expression");
        }
        return std::pair(std::move(condition), std::move(else_expr));
    }